

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>const&>::
captureExpression<(Catch::Internal::Operator)0,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>
          (ExpressionLhs<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>const&> *this,
          vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *rhs)

{
  ResultBuilder *pRVar1;
  bool bVar2;
  OfType OVar3;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *v;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *v_00;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  bVar2 = std::operator==(*(vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> **)(this + 8),rhs)
  ;
  OVar3 = ExpressionFailed;
  if (bVar2) {
    OVar3 = Ok;
  }
  (pRVar1->m_data).resultType = OVar3;
  toString<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>(&local_38,*(Catch **)(this + 8),v);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  toString<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>(&local_58,(Catch *)rhs,v_00);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  std::__cxx11::string::string(local_78,"==",&local_79);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }